

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_widen_u8_aarch64(uint32_t x)

{
  uint64_t ret;
  uint64_t tmp;
  uint32_t x_local;
  
  return (ulong)(x >> 0x18) << 0x30 |
         (ulong)(x >> 0x10 & 0xff) << 0x20 | (ulong)(x >> 8 & 0xff) << 0x10 | (ulong)(x & 0xff);
}

Assistant:

uint64_t HELPER(neon_widen_u8)(uint32_t x)
{
    uint64_t tmp;
    uint64_t ret;
    ret = (uint8_t)x;
    tmp = (uint8_t)(x >> 8);
    ret |= tmp << 16;
    tmp = (uint8_t)(x >> 16);
    ret |= tmp << 32;
    tmp = (uint8_t)(x >> 24);
    ret |= tmp << 48;
    return ret;
}